

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img.cpp
# Opt level: O2

bool __thiscall
tg::Img<glm::vec<3,_float,_(glm::qualifier)0>_>::save
          (Img<glm::vec<3,_float,_(glm::qualifier)0>_> *this,char *fileName,int quality)

{
  int x;
  int y;
  int iVar1;
  vec<3,_float,_(glm::qualifier)0> *data;
  int iVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *c;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  void *data_00;
  int iVar13;
  float fVar14;
  
  data = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._data;
  x = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._w;
  y = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._h;
  iVar1 = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._stride;
  pcVar11 = (char *)0x0;
  for (pcVar6 = fileName; (pcVar12 = pcVar6, *pcVar6 == '.' || (pcVar12 = pcVar11, *pcVar6 != '\0'))
      ; pcVar6 = pcVar6 + 1) {
    pcVar11 = pcVar12;
  }
  if (pcVar11 == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    cVar3 = pcVar11[1];
    bVar7 = (byte)(cVar3 + 0x9eU) >> 1 | cVar3 << 7;
    if (bVar7 < 10) {
      data_00 = (void *)0x0;
      if ((0x291U >> (bVar7 & 0x1f) & 1) != 0) {
        data_00 = operator_new__((long)(x * y * 3));
        iVar5 = 0;
        if (0 < x) {
          iVar5 = x;
        }
        iVar8 = 0;
        if (0 < y) {
          iVar8 = y;
        }
        iVar13 = 0;
        for (iVar4 = 0; iVar4 != iVar8; iVar4 = iVar4 + 1) {
          iVar2 = iVar13;
          for (iVar10 = 0; iVar13 = iVar13 + 3, iVar10 != iVar5; iVar10 = iVar10 + 1) {
            for (lVar9 = (long)iVar2; iVar13 != lVar9; lVar9 = lVar9 + 1) {
              fVar14 = powf((&data->field_0)[lVar9].x,0.45454544);
              *(char *)((long)data_00 + lVar9) = (char)(int)(fVar14 * 255.0);
            }
            iVar2 = iVar2 + 3;
          }
          iVar13 = iVar2;
        }
        cVar3 = pcVar11[1];
      }
    }
    else {
      data_00 = (void *)0x0;
    }
    iVar5 = 0;
    switch((int)cVar3 - 0x62U >> 1 | (uint)(((int)cVar3 - 0x62U & 1) != 0) << 0x1f) {
    case 0:
      iVar5 = stbi_write_bmp(fileName,x,y,3,data_00);
      break;
    case 3:
      iVar5 = stbi_write_hdr(fileName,x,y,3,(float *)data);
      break;
    case 4:
      iVar5 = stbi_write_jpg(fileName,x,y,3,data_00,quality);
      break;
    case 7:
      iVar5 = stbi_write_png(fileName,x,y,3,data_00,iVar1 * 3);
      break;
    case 9:
      iVar5 = stbi_write_tga(fileName,x,y,3,data_00);
    }
    if (data_00 != (void *)0x0) {
      operator_delete__(data_00);
    }
  }
  return iVar5 != 0;
}

Assistant:

bool Img<vec3>::save(const char* fileName, int quality)
{
    return saveImgFloatN<3>(fileName, _data, _w, _h, _stride, quality);
}